

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

uint32 __thiscall crnd::symbol_codec::decode_bits(symbol_codec *this,uint32 num_bits)

{
  uint32 uVar1;
  uint32 uVar2;
  
  if (num_bits == 0) {
    uVar2 = 0;
  }
  else {
    if (num_bits < 0x11) {
      uVar2 = get_bits(this,num_bits);
      return uVar2;
    }
    uVar1 = get_bits(this,num_bits - 0x10);
    uVar2 = get_bits(this,0x10);
    uVar2 = uVar1 << 0x10 | uVar2;
  }
  return uVar2;
}

Assistant:

uint32 symbol_codec::decode_bits(uint32 num_bits)
    {
        if (!num_bits)
            return 0;

        if (num_bits > 16)
        {
            uint32 a = get_bits(num_bits - 16);
            uint32 b = get_bits(16);

            return (a << 16) | b;
        }
        else
            return get_bits(num_bits);
    }